

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_get_urlarg_by_name_safe(lws *wsi,char *name,char *buf,int len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int frag_idx;
  
  sVar4 = strlen(name);
  iVar3 = (int)sVar4;
  iVar1 = lws_hdr_copy_fragment(wsi,buf,len,WSI_TOKEN_HTTP_URI_ARGS,0);
  if (-1 < iVar1) {
    frag_idx = 1;
    do {
      if ((iVar3 <= iVar1 && iVar1 + 1 < len) && (iVar2 = strncmp(buf,name,(long)iVar3), iVar2 == 0)
         ) {
        if ((name[(long)((sVar4 << 0x20) + -0x100000000) >> 0x20] != '=') && (iVar3 < iVar1)) {
          iVar3 = (uint)(buf[iVar3] == '=') + iVar3;
        }
        iVar1 = iVar1 - iVar3;
        memmove(buf,buf + iVar3,(long)iVar1);
        buf[iVar1] = '\0';
        return iVar1;
      }
      iVar1 = lws_hdr_copy_fragment(wsi,buf,len,WSI_TOKEN_HTTP_URI_ARGS,frag_idx);
      frag_idx = frag_idx + 1;
    } while (-1 < iVar1);
  }
  return -1;
}

Assistant:

int
lws_get_urlarg_by_name_safe(struct lws *wsi, const char *name, char *buf, int len)
{
	int n = 0, fraglen, sl = (int)strlen(name);

	do {
		fraglen = lws_hdr_copy_fragment(wsi, buf, len,
						WSI_TOKEN_HTTP_URI_ARGS, n);

		if (fraglen < 0)
			break;

		if (fraglen + 1 < len &&
		    fraglen >= sl &&
		    !strncmp(buf, name, (size_t)sl)) {
			/*
			 * If he left off the trailing =, trim it from the
			 * result
			 */

			if (name[sl - 1] != '=' &&
			    sl < fraglen &&
			    buf[sl] == '=')
				sl++;

			memmove(buf, buf + sl, (size_t)(fraglen - sl));
			buf[fraglen - sl] = '\0';

			return fraglen - sl;
		}

		n++;
	} while (1);

	return -1;
}